

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.cpp
# Opt level: O0

int mbedtls_mpi_add_abs(mbedtls_mpi *X,mbedtls_mpi *A,mbedtls_mpi *B)

{
  mbedtls_mpi_uint **ppmVar1;
  int iVar2;
  mbedtls_mpi_uint *nblimbs;
  mbedtls_mpi *X_00;
  long *in_RDX;
  long *in_RSI;
  long *in_RDI;
  mbedtls_mpi *T;
  mbedtls_mpi_uint c;
  mbedtls_mpi_uint *p;
  size_t j;
  int ret;
  mbedtls_mpi *in_stack_ffffffffffffffc0;
  mbedtls_mpi *in_stack_ffffffffffffffc8;
  mbedtls_mpi_uint *X_01;
  size_t local_30;
  int local_24;
  long *local_20;
  long *local_18;
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  if (in_RDI == in_RDX) {
    local_20 = in_RSI;
    local_18 = in_RDI;
  }
  if ((in_RDI == local_18) ||
     (local_24 = mbedtls_mpi_copy(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0),
     local_24 == 0)) {
    *(undefined2 *)(in_RDI + 1) = 1;
    local_30 = (size_t)*(ushort *)((long)local_20 + 10);
    while ((local_30 != 0 && (*(long *)(*local_20 + (local_30 - 1) * 8) == 0))) {
      local_30 = local_30 - 1;
    }
    if (local_30 == 0) {
      return 0;
    }
    local_24 = mbedtls_mpi_grow(in_stack_ffffffffffffffc8,(size_t)in_stack_ffffffffffffffc0);
    if (local_24 == 0) {
      X_01 = (mbedtls_mpi_uint *)*in_RDI;
      nblimbs = (mbedtls_mpi_uint *)
                mbedtls_mpi_core_add(X_01,X_01,(mbedtls_mpi_uint *)*local_20,local_30);
      X_00 = (mbedtls_mpi *)(X_01 + local_30);
      for (; nblimbs != (mbedtls_mpi_uint *)0x0;
          nblimbs = (mbedtls_mpi_uint *)(ulong)(*ppmVar1 < nblimbs)) {
        if (*(ushort *)((long)in_RDI + 10) <= local_30) {
          iVar2 = mbedtls_mpi_grow(X_00,(size_t)nblimbs);
          if (iVar2 != 0) {
            return iVar2;
          }
          X_00 = (mbedtls_mpi *)(*in_RDI + local_30 * 8);
          local_24 = 0;
        }
        X_00->p = (mbedtls_mpi_uint *)((long)nblimbs + (long)X_00->p);
        ppmVar1 = &X_00->p;
        local_30 = local_30 + 1;
        X_00 = (mbedtls_mpi *)&X_00->s;
      }
    }
  }
  return local_24;
}

Assistant:

int mbedtls_mpi_add_abs(mbedtls_mpi *X, const mbedtls_mpi *A, const mbedtls_mpi *B)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    size_t j;
    mbedtls_mpi_uint *p;
    mbedtls_mpi_uint c;

    if (X == B) {
        const mbedtls_mpi *T = A; A = X; B = T;
    }

    if (X != A) {
        MBEDTLS_MPI_CHK(mbedtls_mpi_copy(X, A));
    }

    /*
     * X must always be positive as a result of unsigned additions.
     */
    X->s = 1;

    for (j = B->n; j > 0; j--) {
        if (B->p[j - 1] != 0) {
            break;
        }
    }

    /* Exit early to avoid undefined behavior on NULL+0 when X->n == 0
     * and B is 0 (of any size). */
    if (j == 0) {
        return 0;
    }

    MBEDTLS_MPI_CHK(mbedtls_mpi_grow(X, j));

    /* j is the number of non-zero limbs of B. Add those to X. */

    p = X->p;

    c = mbedtls_mpi_core_add(p, p, B->p, j);

    p += j;

    /* Now propagate any carry */

    while (c != 0) {
        if (j >= X->n) {
            MBEDTLS_MPI_CHK(mbedtls_mpi_grow(X, j + 1));
            p = X->p + j;
        }

        *p += c; c = (*p < c); j++; p++;
    }

cleanup:

    return ret;
}